

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O0

adjusted_mantissa __thiscall
fast_float::negative_digit_comp<float>
          (fast_float *this,bigint *bigmant,adjusted_mantissa am,int32_t exponent)

{
  ulong uVar1;
  undefined4 uVar2;
  adjusted_mantissa *paVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint32_t exp;
  int *piVar7;
  adjusted_mantissa aVar8;
  int ord;
  uint32_t pow5_exp;
  int32_t pow2_exp;
  int32_t theor_exp;
  bigint theor_digits;
  adjusted_mantissa theor;
  int local_120;
  float b;
  adjusted_mantissa am_b;
  int32_t real_exp;
  bigint *real_digits;
  int32_t exponent_local;
  bigint *bigmant_local;
  adjusted_mantissa am_local;
  adjusted_mantissa answer;
  fastfloat_uint_conflict word;
  int local_94;
  int local_90;
  int local_8c;
  int32_t shift;
  int32_t mantissa_shift;
  anon_class_1_0_00000001 local_79;
  ulong local_78;
  int local_70;
  uint local_64;
  uint64_t local_60;
  adjusted_mantissa am_1;
  int local_48;
  int local_44;
  int32_t shift_1;
  int32_t mantissa_shift_1;
  anon_class_4_1_ba1d6a41 local_34;
  uint local_30;
  int local_2c;
  equiv_uint bits;
  int32_t bias;
  equiv_uint hidden_bit_mask;
  equiv_uint mantissa_mask;
  equiv_uint exponent_mask;
  adjusted_mantissa am_2;
  
  am_local.mantissa._0_4_ = (undefined4)am.mantissa;
  am_b._12_4_ = am.power2;
  am_b.mantissa = CONCAT44(am_local.mantissa._4_4_,(undefined4)am_local.mantissa);
  _shift = (adjusted_mantissa *)&b;
  _b = bigmant;
  local_8c = binary_format<float>::mantissa_explicit_bits();
  paVar3 = _shift;
  local_8c = 0x3f - local_8c;
  if (-_shift->power2 < local_8c) {
    negative_digit_comp<float>::anon_class_1_0_00000001::operator()(&local_79,_shift,local_8c);
    uVar1 = _shift->mantissa;
    iVar4 = binary_format<float>::mantissa_explicit_bits();
    if ((ulong)(2L << ((byte)iVar4 & 0x3f)) <= uVar1) {
      iVar4 = binary_format<float>::mantissa_explicit_bits();
      _shift->mantissa = 1L << ((byte)iVar4 & 0x3f);
      _shift->power2 = _shift->power2 + 1;
    }
    iVar4 = binary_format<float>::mantissa_explicit_bits();
    _shift->mantissa = (1L << ((byte)iVar4 & 0x3f) ^ 0xffffffffffffffffU) & _shift->mantissa;
    iVar4 = _shift->power2;
    iVar5 = binary_format<float>::infinite_power();
    if (iVar5 <= iVar4) {
      iVar4 = binary_format<float>::infinite_power();
      _shift->power2 = iVar4;
      _shift->mantissa = 0;
    }
  }
  else {
    local_90 = 1 - _shift->power2;
    local_94 = 0x40;
    piVar7 = std::min<int>(&local_90,&local_94);
    negative_digit_comp<float>::anon_class_1_0_00000001::operator()(&local_79,paVar3,*piVar7);
    uVar1 = _shift->mantissa;
    iVar4 = binary_format<float>::mantissa_explicit_bits();
    _shift->power2 = (uint)((ulong)(1L << ((byte)iVar4 & 0x3f)) <= uVar1);
  }
  local_120 = (int)am_b.mantissa;
  uVar6 = (uint)_b;
  iVar4 = binary_format<float>::mantissa_explicit_bits();
  iVar5 = binary_format<float>::sign_index();
  local_64 = 0 << ((byte)iVar5 & 0x1f) | local_120 << ((byte)iVar4 & 0x1f) | uVar6;
  hidden_bit_mask = 0x7f800000;
  bias = 0x7fffff;
  bits = 0x800000;
  mantissa_mask = local_64;
  adjusted_mantissa::adjusted_mantissa((adjusted_mantissa *)&exponent_mask);
  iVar4 = binary_format<float>::mantissa_explicit_bits();
  local_2c = binary_format<float>::minimum_exponent();
  local_2c = iVar4 - local_2c;
  local_30 = mantissa_mask;
  if ((mantissa_mask & 0x7f800000) == 0) {
    am_2.mantissa._0_4_ = 1 - local_2c;
    uVar6 = mantissa_mask & 0x7fffff;
  }
  else {
    uVar6 = mantissa_mask & 0x7f800000;
    iVar4 = binary_format<float>::mantissa_explicit_bits();
    am_2.mantissa._0_4_ = (uVar6 >> ((byte)iVar4 & 0x1f)) - local_2c;
    uVar6 = local_30 & 0x7fffff | 0x800000;
  }
  _exponent_mask = (ulong)uVar6;
  local_70 = (int)am_2.mantissa;
  local_78 = _exponent_mask;
  theor_digits.vec._496_8_ = _exponent_mask * 2 + 1;
  iVar4 = (int)am_2.mantissa + -1;
  local_60 = theor_digits.vec._496_8_;
  am_1.mantissa._0_4_ = iVar4;
  bigint::bigint((bigint *)&pow2_exp,theor_digits.vec._496_8_);
  exp = iVar4 - am_b._12_4_;
  if (-am_b._12_4_ != 0) {
    bigint::pow5((bigint *)&pow2_exp,-am_b._12_4_);
  }
  if ((int)exp < 1) {
    if ((int)exp < 0) {
      bigint::pow2((bigint *)this,-exp);
    }
  }
  else {
    bigint::pow2((bigint *)&pow2_exp,exp);
  }
  local_34.ord = bigint::compare((bigint *)this,(bigint *)&pow2_exp);
  uVar2 = (undefined4)am_local.mantissa;
  _shift_1 = (adjusted_mantissa *)&am_local.power2;
  am_local._8_8_ = bigmant;
  local_44 = binary_format<float>::mantissa_explicit_bits();
  paVar3 = _shift_1;
  local_44 = 0x3f - local_44;
  if (-_shift_1->power2 < local_44) {
    negative_digit_comp<float>::anon_class_4_1_ba1d6a41::operator()(&local_34,_shift_1,local_44);
    uVar1 = _shift_1->mantissa;
    iVar4 = binary_format<float>::mantissa_explicit_bits();
    if ((ulong)(2L << ((byte)iVar4 & 0x3f)) <= uVar1) {
      iVar4 = binary_format<float>::mantissa_explicit_bits();
      _shift_1->mantissa = 1L << ((byte)iVar4 & 0x3f);
      _shift_1->power2 = _shift_1->power2 + 1;
    }
    iVar4 = binary_format<float>::mantissa_explicit_bits();
    _shift_1->mantissa = (1L << ((byte)iVar4 & 0x3f) ^ 0xffffffffffffffffU) & _shift_1->mantissa;
    iVar4 = _shift_1->power2;
    iVar5 = binary_format<float>::infinite_power();
    if (iVar5 <= iVar4) {
      iVar4 = binary_format<float>::infinite_power();
      _shift_1->power2 = iVar4;
      _shift_1->mantissa = 0;
    }
  }
  else {
    local_48 = 1 - _shift_1->power2;
    am_1._12_4_ = 0x40;
    piVar7 = std::min<int>(&local_48,(int *)&am_1.field_0xc);
    negative_digit_comp<float>::anon_class_4_1_ba1d6a41::operator()(&local_34,paVar3,*piVar7);
    uVar1 = _shift_1->mantissa;
    iVar4 = binary_format<float>::mantissa_explicit_bits();
    _shift_1->power2 = (uint)((ulong)(1L << ((byte)iVar4 & 0x3f)) <= uVar1);
  }
  aVar8.power2 = uVar2;
  aVar8.mantissa = am_local._8_8_;
  aVar8._12_4_ = 0;
  return aVar8;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa negative_digit_comp(bigint& bigmant, adjusted_mantissa am, int32_t exponent) noexcept {
  bigint& real_digits = bigmant;
  int32_t real_exp = exponent;

  // get the value of `b`, rounded down, and get a bigint representation of b+h
  adjusted_mantissa am_b = am;
  // gcc7 buf: use a lambda to remove the noexcept qualifier bug with -Wnoexcept-type.
  round<T>(am_b, [](adjusted_mantissa&a, int32_t shift) { round_down(a, shift); });
  T b;
  to_float(false, am_b, b);
  adjusted_mantissa theor = to_extended_halfway(b);
  bigint theor_digits(theor.mantissa);
  int32_t theor_exp = theor.power2;

  // scale real digits and theor digits to be same power.
  int32_t pow2_exp = theor_exp - real_exp;
  uint32_t pow5_exp = uint32_t(-real_exp);
  if (pow5_exp != 0) {
    FASTFLOAT_ASSERT(theor_digits.pow5(pow5_exp));
  }
  if (pow2_exp > 0) {
    FASTFLOAT_ASSERT(theor_digits.pow2(uint32_t(pow2_exp)));
  } else if (pow2_exp < 0) {
    FASTFLOAT_ASSERT(real_digits.pow2(uint32_t(-pow2_exp)));
  }

  // compare digits, and use it to director rounding
  int ord = real_digits.compare(theor_digits);
  adjusted_mantissa answer = am;
  round<T>(answer, [ord](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [ord](bool is_odd, bool _, bool __) -> bool {
      (void)_;  // not needed, since we've done our comparison
      (void)__; // not needed, since we've done our comparison
      if (ord > 0) {
        return true;
      } else if (ord < 0) {
        return false;
      } else {
        return is_odd;
      }
    });
  });

  return answer;
}